

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderAtomicCompSwapCase::init
          (ShaderAtomicCompSwapCase *this,EVP_PKEY_CTX *ctx)

{
  AtomicOperandType AVar1;
  RenderContext *renderCtx;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  ShaderProgram *pSVar6;
  ProgramSources *sources;
  TestError *this_00;
  char *pcVar7;
  string local_2c0;
  undefined1 local_2a0 [40];
  ProgramSources local_278;
  ostringstream src;
  
  AVar1 = this->m_operandType;
  pcVar3 = glu::getPrecisionName(this->m_precision);
  pcVar4 = glu::getDataTypeName(this->m_type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  poVar5 = std::operator<<((ostream *)&src,"#version 310 es\n");
  poVar5 = std::operator<<(poVar5,"layout(local_size_x = ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,", local_size_y = ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,", local_size_z = ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,") in;\n");
  poVar5 = std::operator<<(poVar5,"layout(binding = 0) buffer InOut\n");
  poVar5 = std::operator<<(poVar5,"{\n");
  poVar5 = std::operator<<(poVar5,"\t");
  poVar5 = std::operator<<(poVar5,pcVar3);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::operator<<(poVar5," compareValues[");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,"];\n");
  poVar5 = std::operator<<(poVar5,"\t");
  poVar5 = std::operator<<(poVar5,pcVar3);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::operator<<(poVar5," exchangeValues[");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,"];\n");
  poVar5 = std::operator<<(poVar5,"\t");
  poVar5 = std::operator<<(poVar5,pcVar3);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::operator<<(poVar5," outputValues[");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,"];\n");
  poVar5 = std::operator<<(poVar5,"\t");
  pcVar7 = glcts::fixed_sample_locations_values + 1;
  if (AVar1 == ATOMIC_OPERAND_BUFFER_VARIABLE) {
    pcVar7 = "coherent ";
  }
  poVar5 = std::operator<<(poVar5,pcVar7);
  poVar5 = std::operator<<(poVar5,pcVar3);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::operator<<(poVar5," groupValues[");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,"];\n");
  std::operator<<(poVar5,"} sb_inout;\n");
  if (AVar1 != ATOMIC_OPERAND_BUFFER_VARIABLE) {
    poVar5 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,"shared ");
    poVar5 = std::operator<<(poVar5,pcVar3);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,pcVar4);
    std::operator<<(poVar5," s_var;\n");
  }
  poVar5 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  poVar5 = std::operator<<(poVar5,"void main (void)\n");
  poVar5 = std::operator<<(poVar5,"{\n");
  poVar5 = std::operator<<(poVar5,
                           "\tuint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
                          );
  poVar5 = std::operator<<(poVar5,
                           "\tuint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                          );
  poVar5 = std::operator<<(poVar5,"\tuint globalOffs = localSize*globalNdx;\n");
  poVar5 = std::operator<<(poVar5,"\tuint offset     = globalOffs + gl_LocalInvocationIndex;\n");
  std::operator<<(poVar5,"\n");
  if (AVar1 != ATOMIC_OPERAND_BUFFER_VARIABLE) {
    poVar5 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,
                             "\tif (gl_LocalInvocationIndex == 0u)\n");
    poVar5 = std::operator<<(poVar5,"\t\ts_var = ");
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
    poVar5 = std::operator<<(poVar5,");\n");
    std::operator<<(poVar5,"\n");
  }
  poVar5 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,"\t");
  poVar5 = std::operator<<(poVar5,pcVar3);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::operator<<(poVar5," compare = sb_inout.compareValues[offset];\n");
  poVar5 = std::operator<<(poVar5,"\t");
  poVar5 = std::operator<<(poVar5,pcVar3);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::operator<<(poVar5," exchange = sb_inout.exchangeValues[offset];\n");
  poVar5 = std::operator<<(poVar5,"\t");
  poVar5 = std::operator<<(poVar5,pcVar3);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::operator<<(poVar5," result;\n");
  poVar5 = std::operator<<(poVar5,"\tbool swapDone = false;\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"\tfor (uint ndx = 0u; ndx < localSize; ndx++)\n");
  poVar5 = std::operator<<(poVar5,"\t{\n");
  poVar5 = std::operator<<(poVar5,"\t\tbarrier();\n");
  poVar5 = std::operator<<(poVar5,"\t\tif (!swapDone)\n");
  poVar5 = std::operator<<(poVar5,"\t\t{\n");
  poVar5 = std::operator<<(poVar5,"\t\t\tresult = atomicCompSwap(");
  pcVar3 = "s_var";
  if (AVar1 == ATOMIC_OPERAND_BUFFER_VARIABLE) {
    pcVar3 = "sb_inout.groupValues[globalNdx]";
  }
  poVar5 = std::operator<<(poVar5,pcVar3);
  poVar5 = std::operator<<(poVar5,", compare, exchange);\n");
  poVar5 = std::operator<<(poVar5,"\t\t\tif (result == compare)\n");
  poVar5 = std::operator<<(poVar5,"\t\t\t\tswapDone = true;\n");
  poVar5 = std::operator<<(poVar5,"\t\t}\n");
  poVar5 = std::operator<<(poVar5,"\t}\n");
  poVar5 = std::operator<<(poVar5,"\n");
  std::operator<<(poVar5,"\tsb_inout.outputValues[offset] = result;\n");
  if (AVar1 != ATOMIC_OPERAND_BUFFER_VARIABLE) {
    poVar5 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,
                             "\tbarrier();\n");
    poVar5 = std::operator<<(poVar5,"\tif (gl_LocalInvocationIndex == 0u)\n");
    std::operator<<(poVar5,"\t\tsb_inout.groupValues[globalNdx] = s_var;\n");
  }
  std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  pSVar6 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&local_278,0,0xac);
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_278.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_278._193_8_ = 0;
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)local_2a0,&local_2c0);
  sources = glu::ProgramSources::operator<<(&local_278,(ShaderSource *)local_2a0);
  glu::ShaderProgram::ShaderProgram(pSVar6,renderCtx,sources);
  this->m_program = pSVar6;
  std::__cxx11::string::~string((string *)(local_2a0 + 8));
  std::__cxx11::string::~string((string *)&local_2c0);
  glu::ProgramSources::~ProgramSources(&local_278);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  pSVar6 = this->m_program;
  if ((pSVar6->m_program).m_info.linkOk != false) {
    iVar2 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
    return iVar2;
  }
  glu::ShaderProgram::~ShaderProgram(pSVar6);
  operator_delete(pSVar6,0xd0);
  this->m_program = (ShaderProgram *)0x0;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"Compile failed",(allocator<char> *)local_2a0);
  tcu::TestError::TestError(this_00,(string *)&local_278);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderAtomicCompSwapCase::init (void)
{
	const bool			isSSBO		= m_operandType == ATOMIC_OPERAND_BUFFER_VARIABLE;
	const char*			precName	= getPrecisionName(m_precision);
	const char*			typeName	= getDataTypeName(m_type);
	const deUint32		numValues	= product(m_workGroupSize)*product(m_numWorkGroups);
	std::ostringstream	src;

	src << "#version 310 es\n"
		<< "layout(local_size_x = " << m_workGroupSize.x()
		<< ", local_size_y = " << m_workGroupSize.y()
		<< ", local_size_z = " << m_workGroupSize.z() << ") in;\n"
		<< "layout(binding = 0) buffer InOut\n"
		<< "{\n"
		<< "	" << precName << " " << typeName << " compareValues[" << numValues << "];\n"
		<< "	" << precName << " " << typeName << " exchangeValues[" << numValues << "];\n"
		<< "	" << precName << " " << typeName << " outputValues[" << numValues << "];\n"
		<< "	" << (isSSBO ? "coherent " : "") << precName << " " << typeName << " groupValues[" << product(m_numWorkGroups) << "];\n"
		<< "} sb_inout;\n";

	if (!isSSBO)
		src << "shared " << precName << " " << typeName << " s_var;\n";

	src << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
		<< "	uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
		<< "	uint globalOffs = localSize*globalNdx;\n"
		<< "	uint offset     = globalOffs + gl_LocalInvocationIndex;\n"
		<< "\n";

	if (!isSSBO)
	{
		src << "	if (gl_LocalInvocationIndex == 0u)\n"
			<< "		s_var = " << typeName << "(" << 0 << ");\n"
			<< "\n";
	}

	src << "	" << precName << " " << typeName << " compare = sb_inout.compareValues[offset];\n"
		<< "	" << precName << " " << typeName << " exchange = sb_inout.exchangeValues[offset];\n"
		<< "	" << precName << " " << typeName << " result;\n"
		<< "	bool swapDone = false;\n"
		<< "\n"
		<< "	for (uint ndx = 0u; ndx < localSize; ndx++)\n"
		<< "	{\n"
		<< "		barrier();\n"
		<< "		if (!swapDone)\n"
		<< "		{\n"
		<< "			result = atomicCompSwap(" << (isSSBO ? "sb_inout.groupValues[globalNdx]" : "s_var") << ", compare, exchange);\n"
		<< "			if (result == compare)\n"
		<< "				swapDone = true;\n"
		<< "		}\n"
		<< "	}\n"
		<< "\n"
		<< "	sb_inout.outputValues[offset] = result;\n";

	if (!isSSBO)
	{
		src << "	barrier();\n"
			<< "	if (gl_LocalInvocationIndex == 0u)\n"
			<< "		sb_inout.groupValues[globalNdx] = s_var;\n";
	}

	src << "}\n";

	DE_ASSERT(!m_program);
	m_program = new ShaderProgram(m_context.getRenderContext(), ProgramSources() << ComputeSource(src.str()));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		delete m_program;
		m_program = DE_NULL;
		throw tcu::TestError("Compile failed");
	}
}